

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessOutput.cxx
# Opt level: O3

Encoding cmProcessOutput::FindEncoding(string *name)

{
  int iVar1;
  Encoding EVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    EVar2 = UTF8;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 == 0) {
      EVar2 = None;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        EVar2 = ANSI;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        EVar2 = (uint)(iVar1 == 0) * 3 + Auto;
      }
    }
  }
  return EVar2;
}

Assistant:

cmProcessOutput::Encoding cmProcessOutput::FindEncoding(
  std::string const& name)
{
  Encoding encoding = Auto;
  if (name == "UTF8") {
    encoding = UTF8;
  } else if (name == "NONE") {
    encoding = None;
  } else if (name == "ANSI") {
    encoding = ANSI;
  } else if (name == "OEM") {
    encoding = OEM;
  }
  return encoding;
}